

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerFrame.hpp
# Opt level: O2

int __thiscall Husky::ServerFrame::init(ServerFrame *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  allocator local_29;
  string local_28;
  
  bVar1 = BindToLocalHost(this,&this->m_lsnSock,this->m_nLsnPort);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_28,"init ok {port:%d, threadNum:%d}",&local_29);
    Limonp::Logger::LoggingF
              (1,"ServerFrame.hpp",0x51,&local_28,(ulong)this->m_nLsnPort,
               (ulong)this->m_nThreadCount);
    std::__cxx11::string::~string((string *)&local_28);
    iVar2 = (*this->m_pHandler->_vptr_IRequestHandler[2])();
    if ((char)iVar2 != '\0') {
      return (int)CONCAT71((uint7)(uint3)((uint)iVar2 >> 8),1);
    }
    std::__cxx11::string::string((string *)&local_28,"m_pHandler init failed.",&local_29);
    Limonp::Logger::LoggingF(4,"ServerFrame.hpp",0x55,&local_28);
  }
  else {
    std::__cxx11::string::string((string *)&local_28,"BindToLocalHost failed.",&local_29);
    Limonp::Logger::LoggingF(4,"ServerFrame.hpp",0x4e,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return 0;
}

Assistant:

virtual bool init()  
            {

                if (!BindToLocalHost(m_lsnSock,m_nLsnPort))
                {
                    LogFatal("BindToLocalHost failed.");
                    return false;
                }
                LogInfo("init ok {port:%d, threadNum:%d}", m_nLsnPort, m_nThreadCount);

                if(!m_pHandler->init())
                {
                    LogFatal("m_pHandler init failed.");
                    return false;
                }
                return true;
            }